

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwHideWindow(GLFWwindow *handle)

{
  long in_RDI;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (*(long *)(in_RDI + 0x40) == 0) {
    _glfwPlatformHideWindow((_GLFWwindow *)0x4a0b19);
  }
  return;
}

Assistant:

GLFWAPI void glfwHideWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformHideWindow(window);
}